

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRenderer.cpp
# Opt level: O2

GdlRuleTable * __thiscall
GdlRenderer::GetRuleTable(GdlRenderer *this,GrpLineAndFile *lnf,string *staTableName)

{
  GrcSymbolTable *this_00;
  bool bVar1;
  GdlRuleTable *pGVar2;
  Symbol this_01;
  allocator local_d2;
  allocator local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  GdlRuleTable *local_70;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)staTableName);
  pGVar2 = FindRuleTable(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this_00 = g_cman.m_psymtbl;
  if (pGVar2 == (GdlRuleTable *)0x0) {
    std::__cxx11::string::string((string *)&local_68,(string *)staTableName);
    this_01 = GrcSymbolTable::FindSymbol(this_00,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if ((this_01 != (Symbol)0x0) &&
       (bVar1 = GrcSymbolTableEntry::FitsSymbolType(this_01,ksymtTableRule), bVar1)) {
      pGVar2 = (GdlRuleTable *)operator_new(0x50);
      GdlRuleTable::GdlRuleTable(pGVar2,this_01);
      local_70 = pGVar2;
      GrpLineAndFile::operator=((GrpLineAndFile *)pGVar2,lnf);
      std::vector<GdlRuleTable_*,_std::allocator<GdlRuleTable_*>_>::push_back
                (&this->m_vprultbl,&local_70);
      return local_70;
    }
    std::__cxx11::string::string((string *)&local_90,"The ",&local_d1);
    std::__cxx11::string::string((string *)&local_b0,(string *)staTableName);
    std::__cxx11::string::string((string *)&local_d0," table cannot hold rules",&local_d2);
    GrcErrorList::AddError(&g_errorList,0x872,(GdlObject *)0x0,&local_90,&local_b0,&local_d0,lnf);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    pGVar2 = (GdlRuleTable *)0x0;
  }
  return pGVar2;
}

Assistant:

GdlRuleTable * GdlRenderer::GetRuleTable(GrpLineAndFile & lnf, std::string staTableName)
{
	GdlRuleTable * prultbl = FindRuleTable(staTableName);

	if (prultbl)
		return prultbl;

	//	Create a new one, if permissible.

	Symbol psymTableName = g_cman.SymbolTable()->FindSymbol(staTableName);
	Assert(psymTableName);
	if (!psymTableName || !psymTableName->FitsSymbolType(ksymtTableRule))
	{
		g_errorList.AddError(2162, NULL,
			"The ",
			staTableName,
			" table cannot hold rules",
			lnf);
		return NULL;
	}

	prultbl = new GdlRuleTable(psymTableName);
	prultbl->SetLineAndFile(lnf);
	m_vprultbl.push_back(prultbl);

	return prultbl;
}